

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O1

basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
* __thiscall
nlohmann::json_abi_v3_11_3::json_pointer<std::__cxx11::string>::
get_unchecked<nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>
          (json_pointer<std::__cxx11::string> *this,
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          *ptr)

{
  value_t vVar1;
  string_t *psVar2;
  array_t *paVar3;
  int iVar4;
  size_type idx;
  out_of_range *poVar5;
  char (*in_R8) [18];
  string_t *s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_68;
  string local_48;
  
  s = *(string_t **)this;
  psVar2 = *(string_t **)(this + 8);
  do {
    if (s == psVar2) {
      return ptr;
    }
    vVar1 = (ptr->m_data).m_type;
    if (vVar1 == array) {
      iVar4 = std::__cxx11::string::compare((char *)s);
      if (iVar4 == 0) {
        poVar5 = (out_of_range *)__cxa_allocate_exception(0x20);
        paVar3 = (ptr->m_data).m_value.array;
        inja::std::__cxx11::to_string
                  (&local_48,
                   (long)(paVar3->
                         super__Vector_base<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_std::allocator<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
                         )._M_impl.super__Vector_impl_data._M_finish -
                   (long)(paVar3->
                         super__Vector_base<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_std::allocator<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
                         )._M_impl.super__Vector_impl_data._M_start >> 4);
        detail::
        concat<std::__cxx11::string,char_const(&)[18],std::__cxx11::string,char_const(&)[18]>
                  (&bStack_68,(detail *)"array index \'-\' (",(char (*) [18])&local_48,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ") is out of range",in_R8);
        detail::out_of_range::
        create<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_*,_0>
                  (poVar5,0x192,&bStack_68,ptr);
        __cxa_throw(poVar5,&detail::out_of_range::typeinfo,detail::exception::~exception);
      }
      idx = array_index<nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>
                      (s);
      ptr = basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
            ::operator[](ptr,idx);
    }
    else {
      if (vVar1 != object) {
        poVar5 = (out_of_range *)__cxa_allocate_exception(0x20);
        detail::
        concat<std::__cxx11::string,char_const(&)[29],std::__cxx11::string_const&,char_const(&)[2]>
                  (&bStack_68,(detail *)"unresolved reference token \'",(char (*) [29])s,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x18779a,
                   (char (*) [2])in_R8);
        detail::out_of_range::
        create<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_*,_0>
                  (poVar5,0x194,&bStack_68,ptr);
        __cxa_throw(poVar5,&detail::out_of_range::typeinfo,detail::exception::~exception);
      }
      ptr = basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
            ::operator[](ptr,s);
    }
    s = s + 1;
  } while( true );
}

Assistant:

const BasicJsonType& get_unchecked(const BasicJsonType* ptr) const
    {
        for (const auto& reference_token : reference_tokens)
        {
            switch (ptr->type())
            {
                case detail::value_t::object:
                {
                    // use unchecked object access
                    ptr = &ptr->operator[](reference_token);
                    break;
                }

                case detail::value_t::array:
                {
                    if (JSON_HEDLEY_UNLIKELY(reference_token == "-"))
                    {
                        // "-" cannot be used for const access
                        JSON_THROW(detail::out_of_range::create(402, detail::concat("array index '-' (", std::to_string(ptr->m_data.m_value.array->size()), ") is out of range"), ptr));
                    }

                    // use unchecked array access
                    ptr = &ptr->operator[](array_index<BasicJsonType>(reference_token));
                    break;
                }

                case detail::value_t::null:
                case detail::value_t::string:
                case detail::value_t::boolean:
                case detail::value_t::number_integer:
                case detail::value_t::number_unsigned:
                case detail::value_t::number_float:
                case detail::value_t::binary:
                case detail::value_t::discarded:
                default:
                    JSON_THROW(detail::out_of_range::create(404, detail::concat("unresolved reference token '", reference_token, "'"), ptr));
            }
        }

        return *ptr;
    }